

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O0

boolean read_quant_tables(j_compress_ptr cinfo,char *filename,boolean force_baseline)

{
  boolean bVar1;
  FILE *__stream;
  char *in_RSI;
  uint table [64];
  long val;
  int termchar;
  int i;
  int tblno;
  FILE *fp;
  undefined4 local_148 [4];
  boolean in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  uint *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  j_compress_ptr in_stack_fffffffffffffee0;
  undefined4 local_40;
  int local_34;
  int local_30;
  int local_2c;
  boolean local_4;
  
  __stream = fopen(in_RSI,"r");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Can\'t open table file %s\n",in_RSI);
    local_4 = 0;
  }
  else {
    local_2c = 0;
    while (bVar1 = read_text_integer((FILE *)CONCAT44(in_stack_fffffffffffffedc,
                                                      in_stack_fffffffffffffed8),
                                     (long *)in_stack_fffffffffffffed0,
                                     (int *)CONCAT44(in_stack_fffffffffffffecc,
                                                     in_stack_fffffffffffffec8)), bVar1 != 0) {
      if (3 < local_2c) {
        fprintf(_stderr,"Too many tables in file %s\n",in_RSI);
        fclose(__stream);
        return 0;
      }
      for (local_30 = 1; local_30 < 0x40; local_30 = local_30 + 1) {
        bVar1 = read_text_integer((FILE *)CONCAT44(in_stack_fffffffffffffedc,
                                                   in_stack_fffffffffffffed8),
                                  (long *)in_stack_fffffffffffffed0,
                                  (int *)CONCAT44(in_stack_fffffffffffffecc,
                                                  in_stack_fffffffffffffec8));
        if (bVar1 == 0) {
          fprintf(_stderr,"Invalid table data in file %s\n",in_RSI);
          fclose(__stream);
          return 0;
        }
        local_148[local_30] = local_40;
      }
      jpeg_add_quant_table
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,
                 in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
      local_2c = local_2c + 1;
    }
    if (local_34 == -1) {
      fclose(__stream);
      local_4 = 1;
    }
    else {
      fprintf(_stderr,"Non-numeric data in file %s\n",in_RSI);
      fclose(__stream);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

GLOBAL(boolean)
read_quant_tables(j_compress_ptr cinfo, char *filename, boolean force_baseline)
/* Read a set of quantization tables from the specified file.
 * The file is plain ASCII text: decimal numbers with whitespace between.
 * Comments preceded by '#' may be included in the file.
 * There may be one to NUM_QUANT_TBLS tables in the file, each of 64 values.
 * The tables are implicitly numbered 0,1,etc.
 * NOTE: does not affect the qslots mapping, which will default to selecting
 * table 0 for luminance (or primary) components, 1 for chrominance components.
 * You must use -qslots if you want a different component->table mapping.
 */
{
  FILE *fp;
  int tblno, i, termchar;
  long val;
  unsigned int table[DCTSIZE2];

  if ((fp = fopen(filename, "r")) == NULL) {
    fprintf(stderr, "Can't open table file %s\n", filename);
    return FALSE;
  }
  tblno = 0;

  while (read_text_integer(fp, &val, &termchar)) { /* read 1st element of table */
    if (tblno >= NUM_QUANT_TBLS) {
      fprintf(stderr, "Too many tables in file %s\n", filename);
      fclose(fp);
      return FALSE;
    }
    table[0] = (unsigned int)val;
    for (i = 1; i < DCTSIZE2; i++) {
      if (!read_text_integer(fp, &val, &termchar)) {
        fprintf(stderr, "Invalid table data in file %s\n", filename);
        fclose(fp);
        return FALSE;
      }
      table[i] = (unsigned int)val;
    }
#if JPEG_LIB_VERSION >= 70
    jpeg_add_quant_table(cinfo, tblno, table, cinfo->q_scale_factor[tblno],
                         force_baseline);
#else
    jpeg_add_quant_table(cinfo, tblno, table, q_scale_factor[tblno],
                         force_baseline);
#endif
    tblno++;
  }

  if (termchar != EOF) {
    fprintf(stderr, "Non-numeric data in file %s\n", filename);
    fclose(fp);
    return FALSE;
  }

  fclose(fp);
  return TRUE;
}